

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

TestNode * __thiscall
deqp::gles31::Functional::createCase
          (Functional *this,CaseType type,Context *ctx,char *name,char *desc,
          TestFunctionWrapper function)

{
  undefined4 in_register_00000034;
  Context *ctx_00;
  int iVar1;
  anon_union_8_2_9b810bd7_for_m_func in_R9;
  TestFunctionWrapper errorFunc;
  TestFunctionWrapper errorFunc_00;
  TestFunctionWrapper errorFunc_01;
  char *desc_local;
  char *name_local;
  Context *ctx_local;
  CaseType type_local;
  TestFunctionWrapper function_local;
  
  ctx_00 = (Context *)CONCAT44(in_register_00000034,type);
  iVar1 = (int)this;
  if (iVar1 == 0) {
    function_local.m_func.coreFn = (CoreTestFunc)operator_new(0x108);
    errorFunc._0_8_ = (ulong)desc & 0xffffffff;
    errorFunc.m_func.coreFn = in_R9.coreFn;
    anon_unknown_1::CallbackErrorCase::CallbackErrorCase
              ((CallbackErrorCase *)function_local.m_func.coreFn,ctx_00,(char *)ctx,name,errorFunc);
  }
  else if (iVar1 == 1) {
    function_local.m_func.coreFn = (CoreTestFunc)operator_new(0x108);
    errorFunc_00._0_8_ = (ulong)desc & 0xffffffff;
    errorFunc_00.m_func.coreFn = in_R9.coreFn;
    anon_unknown_1::LogErrorCase::LogErrorCase
              ((LogErrorCase *)function_local.m_func.coreFn,ctx_00,(char *)ctx,name,errorFunc_00);
  }
  else if (iVar1 == 2) {
    function_local.m_func.coreFn = (CoreTestFunc)operator_new(0xd8);
    errorFunc_01._0_8_ = (ulong)desc & 0xffffffff;
    errorFunc_01.m_func.coreFn = in_R9.coreFn;
    anon_unknown_1::GetErrorCase::GetErrorCase
              ((GetErrorCase *)function_local.m_func.coreFn,ctx_00,(char *)ctx,name,errorFunc_01);
  }
  else {
    function_local.m_func.coreFn = (CoreTestFunc)0x0;
  }
  return (TestNode *)function_local.m_func.coreFn;
}

Assistant:

tcu::TestNode* createCase (CaseType type, Context& ctx, const char* name, const char* desc, TestFunctionWrapper function)
{
	switch(type)
	{
		case CASETYPE_CALLBACK: return new CallbackErrorCase(ctx, name, desc, function);
		case CASETYPE_LOG:		return new LogErrorCase(ctx, name, desc, function);
		case CASETYPE_GETERROR: return new GetErrorCase(ctx, name, desc, function);

		default:
			DE_FATAL("Invalid type");
	}

	return DE_NULL;
}